

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListRecordingsRequest.h
# Opt level: O1

void __thiscall
io::aeron::archive::codecs::ListRecordingsRequest::sbePosition
          (ListRecordingsRequest *this,uint64_t position)

{
  ListRecordingsRequest *this_00;
  undefined8 extraout_RAX;
  
  if (position <= this->m_bufferLength) {
    this->m_position = position;
    return;
  }
  this_00 = (ListRecordingsRequest *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error((runtime_error *)this_00,"buffer too short [E100]");
  sbePosition(this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void sbePosition(const std::uint64_t position)
    {
        if (SBE_BOUNDS_CHECK_EXPECT((position > m_bufferLength), false))
        {
            throw std::runtime_error("buffer too short [E100]");
        }
        m_position = position;
    }